

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_cd.cpp
# Opt level: O2

void __thiscall CDDAFile::CDDAFile(CDDAFile *this,FileReader *reader)

{
  long lVar1;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  WORD track;
  DWORD chunk;
  DWORD discid;
  
  CDSong::CDSong(&this->super_CDSong);
  (this->super_CDSong).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__CDSong_006ea358;
  iVar4 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[3])(reader);
  lVar1 = reader->Length;
  (*(reader->super_FileReaderBase)._vptr_FileReaderBase[4])(reader,0xc,1);
  while( true ) {
    iVar5 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[3])(reader);
    if (CONCAT44(extraout_var,iVar4) + lVar1 + -8 <= CONCAT44(extraout_var_00,iVar5)) {
      return;
    }
    (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,&chunk,4);
    pp_Var2 = (reader->super_FileReaderBase)._vptr_FileReaderBase;
    if (chunk == 0x20746d66) break;
    (*pp_Var2[2])(reader,&chunk,4);
    (*(reader->super_FileReaderBase)._vptr_FileReaderBase[4])(reader,(ulong)chunk,1);
  }
  (*pp_Var2[4])(reader,6,1);
  (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,&track,2);
  (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,&discid,4);
  bVar3 = CD_InitID(discid,-1);
  if (!bVar3) {
    return;
  }
  bVar3 = CD_CheckTrack((uint)track);
  if (!bVar3) {
    return;
  }
  (this->super_CDSong).m_Inited = true;
  (this->super_CDSong).m_Track = (uint)track;
  return;
}

Assistant:

CDDAFile::CDDAFile (FileReader &reader)
	: CDSong ()
{
	DWORD chunk;
	WORD track;
	DWORD discid;
	long endpos = reader.Tell() + reader.GetLength() - 8;

	// I_RegisterSong already identified this as a CDDA file, so we
	// just need to check the contents we're interested in.
	reader.Seek(12, SEEK_CUR);

	while (reader.Tell() < endpos)
	{
        reader.Read(&chunk, 4);
		if (chunk != (('f')|(('m')<<8)|(('t')<<16)|((' ')<<24)))
		{
            reader.Read(&chunk, 4);
            reader.Seek(chunk, SEEK_CUR);
		}
		else
		{
            reader.Seek(6, SEEK_CUR);
            reader.Read(&track, 2);
            reader.Read(&discid, 4);

			if (CD_InitID (discid) && CD_CheckTrack (track))
			{
				m_Inited = true;
				m_Track = track;
			}
			return;
		}
	}
}